

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseExpression(FScanner *sc,PClassActor *cls,bool mustresolve)

{
  undefined1 local_80 [8];
  FCompileContext ctx;
  FxExpression *data;
  bool mustresolve_local;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  ctx.FunctionArgs.super_TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>._8_8_ =
       ParseExpressionM(sc,cls);
  if (mustresolve) {
    FCompileContext::FCompileContext((FCompileContext *)local_80,(PStruct *)cls,true);
    ctx.FunctionArgs.super_TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>._8_8_
         = (**(code **)(*(long *)ctx.FunctionArgs.
                                 super_TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>
                                 ._8_8_ + 0x10))
                     (ctx.FunctionArgs.
                      super_TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>._8_8_
                      ,(FCompileContext *)local_80);
    FCompileContext::~FCompileContext((FCompileContext *)local_80);
  }
  return (FxExpression *)
         ctx.FunctionArgs.super_TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>.
         _8_8_;
}

Assistant:

FxExpression *ParseExpression (FScanner &sc, PClassActor *cls, bool mustresolve)
{
	FxExpression *data = ParseExpressionM (sc, cls);

	if (mustresolve)
	{
		FCompileContext ctx(cls, true);
		data = data->Resolve(ctx);
	}

	return data;
}